

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscrete.cpp
# Opt level: O0

bool __thiscall
MultiAgentDecisionProcessDiscrete::SetInitialized(MultiAgentDecisionProcessDiscrete *this,bool b)

{
  byte bVar1;
  bool bVar2;
  undefined8 uVar3;
  byte in_SIL;
  E *in_RDI;
  MADPComponentDiscreteStates *unaff_retaddr;
  bool in_stack_00000017;
  MADPComponentDiscreteObservations *in_stack_00000018;
  MultiAgentDecisionProcessDiscrete *in_stack_00000d70;
  undefined7 in_stack_ffffffffffffffe8;
  E *this_00;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = in_SIL & 1;
  bVar2 = SUB81((ulong)in_RDI >> 0x38,0);
  if (bVar1 == 1) {
    this_00 = in_RDI;
    bVar2 = MADPComponentDiscreteActions::SetInitialized
                      ((MADPComponentDiscreteActions *)
                       CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),bVar2);
    if (((bVar2) &&
        (bVar2 = MADPComponentDiscreteObservations::SetInitialized
                           (in_stack_00000018,in_stack_00000017), bVar2)) &&
       (bVar2 = MADPComponentDiscreteStates::SetInitialized
                          (unaff_retaddr,(bool)in_stack_ffffffffffffffff), bVar2)) {
      if (*(long *)&in_RDI[0xc]._m_error == 0) {
        uVar3 = __cxa_allocate_exception(0x28);
        E::E(this_00,(char *)CONCAT17(bVar1,in_stack_ffffffffffffffe8));
        __cxa_throw(uVar3,&E::typeinfo,E::~E);
      }
      if (in_RDI[0xc]._m_error._M_string_length == 0) {
        uVar3 = __cxa_allocate_exception(0x28);
        E::E(this_00,(char *)CONCAT17(bVar1,in_stack_ffffffffffffffe8));
        __cxa_throw(uVar3,&E::typeinfo,E::~E);
      }
      bVar2 = SanityCheck(in_stack_00000d70);
      if (bVar2) {
        *(undefined1 *)&in_RDI[0xc]._vptr_E = 1;
        bVar2 = true;
      }
      else {
        *(undefined1 *)&in_RDI[0xc]._vptr_E = 0;
        bVar2 = false;
      }
    }
    else {
      *(undefined1 *)&in_RDI[0xc]._vptr_E = 0;
      bVar2 = false;
    }
  }
  else {
    MADPComponentDiscreteActions::SetInitialized
              ((MADPComponentDiscreteActions *)
               CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),bVar2);
    MADPComponentDiscreteObservations::SetInitialized(in_stack_00000018,in_stack_00000017);
    MADPComponentDiscreteStates::SetInitialized(unaff_retaddr,(bool)in_stack_ffffffffffffffff);
    *(undefined1 *)&in_RDI[0xc]._vptr_E = 0;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool MultiAgentDecisionProcessDiscrete::SetInitialized(bool b)
{

    if(b == true)
    {
        if(     !_m_A.SetInitialized(b)
            ||  !_m_O.SetInitialized(b)
            ||  !_m_S.SetInitialized(b) )
        {
            //error in initialization of sub-components.
            _m_initialized = false;
            return(false);
        }
        //check if transition- and observation model are present...
        if(_m_p_tModel == 0)
        {
            throw E("MultiAgentDecisionProcessDiscrete::SetInitialized() -initializing a MultiAgentDecisionProcessDiscrete which has no transition model! - make sure that CreateNewTransitionModel() has been called before SetInitialized()");
        }
        if(_m_p_oModel == 0)
        {
            throw E("MultiAgentDecisionProcessDiscrete::SetInitialized() -initializing a MultiAgentDecisionProcessDiscrete which has no observation model! - make sure that CreateNewObservationModel() has been called before SetInitialized()");

        }

        if( SanityCheck() )
        {
            _m_initialized = true;
            return(true);
        }
        else
        {
            _m_initialized = false;
            return(false);
        }
    }
    else
    {
        _m_A.SetInitialized(b);
        _m_O.SetInitialized(b);
        _m_S.SetInitialized(b); 
        _m_initialized = false;
        return(true);
    }

}